

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_status
pugi::impl::anon_unknown_0::load_stream_data_seek<char>
          (basic_istream<char,_std::char_traits<char>_> *stream,void **out_buffer,size_t *out_size)

{
  ulong uVar1;
  streamoff sVar2;
  void *pvVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  size_t actual_length;
  undefined1 local_80 [8];
  auto_deleter<void> buffer;
  size_t max_suffix_size;
  size_t read_length;
  fpos<__mbstate_t> local_50 [16];
  ulong local_40;
  streamoff length;
  pos_type pos;
  size_t *out_size_local;
  void **out_buffer_local;
  basic_istream<char,_std::char_traits<char>_> *stream_local;
  
  auVar5 = std::istream::tellg();
  _pos = auVar5._8_8_;
  length = auVar5._0_8_;
  std::istream::seekg((long)stream,_S_beg);
  local_50 = (fpos<__mbstate_t>  [16])std::istream::tellg();
  local_40 = std::fpos<__mbstate_t>::operator-(local_50,(fpos<__mbstate_t> *)&length);
  std::istream::seekg(stream,length,_pos);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    return status_io_error;
  }
  sVar2 = std::fpos::operator_cast_to_long((fpos *)&length);
  uVar1 = local_40;
  if (sVar2 < 0) {
    return status_io_error;
  }
  if ((long)local_40 < 0) {
    return status_out_of_memory;
  }
  buffer.deleter = (D)0x1;
  pvVar3 = (void *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(local_40 + 1);
  auto_deleter<void>::auto_deleter
            ((auto_deleter<void> *)local_80,pvVar3,
             (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate);
  if (local_80 == (undefined1  [8])0x0) {
    stream_local._4_4_ = status_out_of_memory;
    goto LAB_005657fb;
  }
  std::istream::read((char *)stream,(long)local_80);
  uVar4 = std::ios::bad();
  if ((uVar4 & 1) == 0) {
    uVar4 = std::ios::eof();
    if ((uVar4 & 1) == 0) {
      uVar4 = std::ios::fail();
      if ((uVar4 & 1) != 0) goto LAB_0056577a;
    }
    uVar4 = std::istream::gcount();
    if (uVar1 < uVar4) {
      __assert_fail("actual_length <= read_length",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x1383,
                    "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = char]"
                   );
    }
    pvVar3 = auto_deleter<void>::release((auto_deleter<void> *)local_80);
    *out_buffer = pvVar3;
    *out_size = uVar4;
    stream_local._4_4_ = status_ok;
  }
  else {
LAB_0056577a:
    stream_local._4_4_ = status_io_error;
  }
LAB_005657fb:
  auto_deleter<void>::~auto_deleter((auto_deleter<void> *)local_80);
  return stream_local._4_4_;
}

Assistant:

PUGI_IMPL_FN xml_parse_status load_stream_data_seek(std::basic_istream<T>& stream, void** out_buffer, size_t* out_size)
	{
		// get length of remaining data in stream
		typename std::basic_istream<T>::pos_type pos = stream.tellg();
		stream.seekg(0, std::ios::end);
		std::streamoff length = stream.tellg() - pos;
		stream.seekg(pos);

		if (stream.fail() || pos < 0) return status_io_error;

		// guard against huge files
		size_t read_length = static_cast<size_t>(length);

		if (static_cast<std::streamsize>(read_length) != length || length < 0) return status_out_of_memory;

		size_t max_suffix_size = sizeof(char_t);

		// read stream data into memory (guard against stream exceptions with buffer holder)
		auto_deleter<void> buffer(xml_memory::allocate(read_length * sizeof(T) + max_suffix_size), xml_memory::deallocate);
		if (!buffer.data) return status_out_of_memory;

		stream.read(static_cast<T*>(buffer.data), static_cast<std::streamsize>(read_length));

		// read may set failbit | eofbit in case gcount() is less than read_length (i.e. line ending conversion), so check for other I/O errors
		if (stream.bad() || (!stream.eof() && stream.fail())) return status_io_error;

		// return buffer
		size_t actual_length = static_cast<size_t>(stream.gcount());
		assert(actual_length <= read_length);

		*out_buffer = buffer.release();
		*out_size = actual_length * sizeof(T);

		return status_ok;
	}